

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

int ClipperLib::PointCount(OutPt *Pts)

{
  OutPt **ppOVar1;
  int iVar2;
  OutPt *pOVar3;
  
  iVar2 = 0;
  pOVar3 = Pts;
  if (Pts != (OutPt *)0x0) {
    do {
      iVar2 = iVar2 + 1;
      ppOVar1 = &pOVar3->Next;
      pOVar3 = *ppOVar1;
    } while (*ppOVar1 != Pts);
  }
  return iVar2;
}

Assistant:

int PointCount(OutPt *Pts)
{
    if (!Pts) return 0;
    int result = 0;
    OutPt* p = Pts;
    do
    {
        result++;
        p = p->Next;
    }
    while (p != Pts);
    return result;
}